

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::if_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
          (parser *this,unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args,
          unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_1,
          unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_2)

{
  position_stack_node *this_00;
  element_type *this_01;
  statement_ptr *in_R8;
  source_extend local_48;
  
  this_00 = (position_stack_node *)
            args[0xe]._M_t.
            super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
            super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
            super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (this_00 != (position_stack_node *)0x0) {
    this_01 = (element_type *)operator_new(0x38);
    position_stack_node::extend(&local_48,this_00);
    if_statement::if_statement
              ((if_statement *)this_01,&local_48,(expression_ptr *)args_1,args_2,in_R8);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
  }
  __assert_fail("statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x147,
                "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::if_statement, Args = <std::unique_ptr<mjs::expression>, std::unique_ptr<mjs::statement>, std::unique_ptr<mjs::statement>>]"
               );
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }